

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * BN::makeRandom(BN *__return_storage_ptr__,size_t byteCount)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  BN local_80;
  reference local_68;
  unsigned_short *i;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  allocator<unsigned_short> local_31;
  undefined1 local_30 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> result;
  size_t byteCount_local;
  
  result.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)byteCount;
  std::allocator<unsigned_short>::allocator(&local_31);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30,byteCount >> 1,
             &local_31);
  std::allocator<unsigned_short>::~allocator(&local_31);
  bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  if (bVar1) {
    uVar2 = rand();
    __range2._0_4_ = uVar2 & 0xffff;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<int>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30,(int *)&__range2)
    ;
  }
  else {
    __end2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    i = (unsigned_short *)
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                       *)&i), bVar1) {
      local_68 = __gnu_cxx::
                 __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                 ::operator*(&__end2);
      iVar3 = rand();
      *local_68 = (unsigned_short)iVar3;
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end2);
    }
  }
  BN(&local_80,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  BN(__return_storage_ptr__,&local_80);
  ~BN(&local_80);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

BN BN::makeRandom(size_t byteCount) {
    vector<bt> result(byteCount / bz);
    if (result.empty())
        result.emplace_back(rand() & bmax);
    else
        for (auto& i : result)
            i = rand() & bmax;
    return move(BN(move(result)));
}